

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_load.c
# Opt level: O0

int parse_mtrk_header(smf_track_t *track)

{
  int iVar1;
  chunk_header_struct *chunk;
  chunk_header_struct *mtrk;
  smf_track_t *track_local;
  
  if (track->smf != (smf_t *)0x0) {
    chunk = next_chunk(track->smf);
    if (chunk == (chunk_header_struct *)0x0) {
      track_local._4_4_ = -1;
    }
    else {
      iVar1 = chunk_signature_matches(chunk,"MTrk");
      if (iVar1 == 0) {
        g_log("libsmf",0x10,
              "SMF warning: Expected MTrk signature, got %c%c%c%c instead; ignoring this chunk.",
              (int)chunk->id[0],(int)chunk->id[1],(int)chunk->id[2],(int)chunk->id[3]);
        track_local._4_4_ = -2;
      }
      else {
        track->file_buffer = chunk;
        track->file_buffer_length =
             (chunk->length << 0x18 | (chunk->length & 0xff00) << 8 |
              (chunk->length & 0xff0000) >> 8 | chunk->length >> 0x18) + 8;
        track->next_event_offset = 8;
        track_local._4_4_ = 0;
      }
    }
    return track_local._4_4_;
  }
  __assert_fail("track->smf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_load.c"
                ,0x2af,"int parse_mtrk_header(smf_track_t *)");
}

Assistant:

static int
parse_mtrk_header(smf_track_t *track)
{
	struct chunk_header_struct *mtrk;

	/* Make sure compiler didn't do anything stupid. */
	assert(sizeof(struct chunk_header_struct) == 8);
	assert(track->smf != NULL);

	mtrk = next_chunk(track->smf);

	if (mtrk == NULL)
		return (-1);

	if (!chunk_signature_matches(mtrk, "MTrk")) {
		g_warning("SMF warning: Expected MTrk signature, got %c%c%c%c instead; ignoring this chunk.",
				mtrk->id[0], mtrk->id[1], mtrk->id[2], mtrk->id[3]);
		
		return (-2);
	}

	track->file_buffer = mtrk;
	track->file_buffer_length = sizeof(struct chunk_header_struct) + g_ntohl(mtrk->length);
	track->next_event_offset = sizeof(struct chunk_header_struct);

	return (0);
}